

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O0

int regexec(regex_t *__preg,char *__string,size_t __nmatch,regmatch_t *__pmatch,int __eflags)

{
  re_guts *g_00;
  re_guts *g;
  int eflags_local;
  regmatch_t *pmatch_local;
  size_t nmatch_local;
  char *string_local;
  regex_t *preg_local;
  
  g_00 = (re_guts *)__preg->syntax;
  if ((*(int *)&__preg->buffer == 0xf265) && (g_00->magic == 0xd245)) {
    if ((g_00->iflags & 4U) == 0) {
      if ((ulong)g_00->nstates < 0x21) {
        preg_local._4_4_ = smatcher(g_00,__string,__nmatch,(regmatch_t *)__pmatch,__eflags & 7U);
      }
      else {
        preg_local._4_4_ = lmatcher(g_00,__string,__nmatch,(regmatch_t *)__pmatch,__eflags & 7U);
      }
    }
    else {
      preg_local._4_4_ = 2;
    }
  }
  else {
    preg_local._4_4_ = 2;
  }
  return preg_local._4_4_;
}

Assistant:

int				/* 0 success, REG_NOMATCH failure */
regexec(preg, string, nmatch, pmatch, eflags)
const regex_t *preg;
const char *string;
size_t nmatch;
regmatch_t pmatch[];
int eflags;
{
	register struct re_guts *g = preg->re_g;
#ifdef REDEBUG
#	define	GOODFLAGS(f)	(f)
#else
#	define	GOODFLAGS(f)	((f)&(REG_NOTBOL|REG_NOTEOL|REG_STARTEND))
#endif

	if (preg->re_magic != MAGIC1 || g->magic != MAGIC2)
		return(REG_BADPAT);
	assert(!(g->iflags&BAD));
	if (g->iflags&BAD)		/* backstop for no-debug case */
		return(REG_BADPAT);
	eflags = GOODFLAGS(eflags);

	if (g->nstates <= CHAR_BIT*sizeof(states1) && !(eflags&REG_LARGE))
		return(smatcher(g, (char *)string, nmatch, pmatch, eflags));
	else
		return(lmatcher(g, (char *)string, nmatch, pmatch, eflags));
}